

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstract.h
# Opt level: O1

UnaryOp wasm::Abstract::getUnary(Type type,Op op)

{
  UnaryOp UVar1;
  UnaryOp UVar2;
  bool bVar3;
  
  if (6 < type.id) {
    __assert_fail("isBasic() && \"Basic type expected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                  ,0x1c4,"BasicType wasm::Type::getBasic() const");
  }
  UVar1 = InvalidUnary;
  switch(type.id & 0xffffffff) {
  case 0:
  case 1:
  case 6:
    goto switchD_009e4222_caseD_0;
  case 2:
    UVar2 = InvalidUnary;
    if (op == Popcnt) {
      UVar2 = PopcntInt32;
    }
    bVar3 = op == EqZ;
    UVar1 = EqZInt32;
    break;
  case 3:
    UVar2 = InvalidUnary;
    if (op == Popcnt) {
      UVar2 = PopcntInt64;
    }
    bVar3 = op == EqZ;
    UVar1 = EqZInt64;
    break;
  case 4:
    UVar2 = InvalidUnary;
    if (op == Neg) {
      UVar2 = NegFloat32;
    }
    bVar3 = op == Abs;
    UVar1 = AbsFloat32;
    break;
  case 5:
    UVar2 = InvalidUnary;
    if (op == Neg) {
      UVar2 = NegFloat64;
    }
    bVar3 = op == Abs;
    UVar1 = AbsFloat64;
    break;
  default:
    handle_unreachable("invalid type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/abstract.h"
                       ,0x85);
  }
  if (!bVar3) {
    UVar1 = UVar2;
  }
switchD_009e4222_caseD_0:
  return UVar1;
}

Assistant:

inline UnaryOp getUnary(Type type, Op op) {
  switch (type.getBasic()) {
    case Type::i32: {
      switch (op) {
        case EqZ:
          return EqZInt32;
        case Popcnt:
          return PopcntInt32;
        default:
          return InvalidUnary;
      }
      break;
    }
    case Type::i64: {
      switch (op) {
        case EqZ:
          return EqZInt64;
        case Popcnt:
          return PopcntInt64;
        default:
          return InvalidUnary;
      }
      break;
    }
    case Type::f32: {
      switch (op) {
        case Abs:
          return AbsFloat32;
        case Neg:
          return NegFloat32;
        default:
          return InvalidUnary;
      }
      break;
    }
    case Type::f64: {
      switch (op) {
        case Abs:
          return AbsFloat64;
        case Neg:
          return NegFloat64;
        default:
          return InvalidUnary;
      }
      break;
    }
    case Type::v128:
    case Type::none:
    case Type::unreachable: {
      return InvalidUnary;
    }
  }
  WASM_UNREACHABLE("invalid type");
}